

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

void Gia_ManFromAig_rec(Gia_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int iNextNew;
  int iObjNew;
  Aig_Obj_t *pNext;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  if ((pObj->field_5).iData == 0) {
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaAig.c"
                    ,0x3c,"void Gia_ManFromAig_rec(Gia_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
    }
    pAVar3 = Aig_ObjFanin0(pObj);
    Gia_ManFromAig_rec(pNew,p,pAVar3);
    pAVar3 = Aig_ObjFanin1(pObj);
    Gia_ManFromAig_rec(pNew,p,pAVar3);
    iVar1 = Gia_ObjChild0Copy(pObj);
    iVar2 = Gia_ObjChild1Copy(pObj);
    iVar1 = Gia_ManAppendAnd(pNew,iVar1,iVar2);
    (pObj->field_5).iData = iVar1;
    if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
       (pAVar3 = Aig_ObjEquiv(p,pObj), pAVar3 != (Aig_Obj_t *)0x0)) {
      Gia_ManFromAig_rec(pNew,p,pAVar3);
      iVar1 = Abc_Lit2Var((pObj->field_5).iData);
      iVar2 = Abc_Lit2Var((pAVar3->field_5).iData);
      if (pNew->pNexts != (int *)0x0) {
        pNew->pNexts[iVar1] = iVar2;
      }
    }
  }
  return;
}

Assistant:

void Gia_ManFromAig_rec( Gia_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pNext;
    if ( pObj->iData )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Gia_ManFromAig_rec( pNew, p, Aig_ObjFanin0(pObj) );
    Gia_ManFromAig_rec( pNew, p, Aig_ObjFanin1(pObj) );
    pObj->iData = Gia_ManAppendAnd( pNew, Gia_ObjChild0Copy(pObj), Gia_ObjChild1Copy(pObj) );
    if ( p->pEquivs && (pNext = Aig_ObjEquiv(p, pObj)) )
    {
        int iObjNew, iNextNew;
        Gia_ManFromAig_rec( pNew, p, pNext );
        iObjNew  = Abc_Lit2Var(pObj->iData);
        iNextNew = Abc_Lit2Var(pNext->iData);
        if ( pNew->pNexts )
            pNew->pNexts[iObjNew] = iNextNew;        
    }
}